

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float64 float64_add_arm(float64 a,float64 b,float_status *s)

{
  _Bool _Var1;
  int iVar2;
  float64 fVar3;
  byte bVar4;
  double dVar5;
  
  bVar4 = s->float_exception_flags;
  if (((bVar4 & 0x20) == 0) || (s->float_rounding_mode != '\0')) goto LAB_0054e6fd;
  if (s->flush_inputs_to_zero != '\0') {
    if ((a & 0x7fffffffffffffff) == 0 || (a & 0x7ff0000000000000) != 0) {
      if ((b & 0x7fffffffffffffff) == 0 || (b & 0x7ff0000000000000) != 0) goto LAB_0054e60c;
LAB_0054e6d8:
      b = b & 0x8000000000000000;
      bVar4 = bVar4 | 0x40;
    }
    else {
      a = a & 0x8000000000000000;
      bVar4 = bVar4 | 0x40;
      if ((b & 0x7ff0000000000000) == 0 && (b & 0x7fffffffffffffff) != 0) goto LAB_0054e6d8;
    }
    s->float_exception_flags = bVar4;
  }
LAB_0054e60c:
  iVar2 = __fpclassify((double)a);
  if ((iVar2 == 4) || (iVar2 == 2)) {
    iVar2 = __fpclassify((double)b);
    if ((iVar2 == 4) || (iVar2 == 2)) {
      dVar5 = (double)a + (double)b;
      if (ABS(dVar5) == INFINITY) {
        s->float_exception_flags = bVar4 | 8;
      }
      else if (ABS(dVar5) <= 2.2250738585072014e-308) {
        _Var1 = f64_addsub_post((union_float64)a,(union_float64)b);
        if (_Var1) goto LAB_0054e6fd;
      }
      return (float64)dVar5;
    }
  }
LAB_0054e6fd:
  fVar3 = soft_f64_addsub(a,b,false,s);
  return fVar3;
}

Assistant:

float64 QEMU_FLATTEN
float64_add(float64 a, float64 b, float_status *s)
{
    return float64_addsub(a, b, s, hard_f64_add, soft_f64_add);
}